

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-to-vpack.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string_view json;
  string_view key;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  __tuple_element_t<0UL,_tuple<unsigned_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_unsigned_long>_>
  *p_Var6;
  __tuple_element_t<1UL,_tuple<unsigned_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_unsigned_long>_>
  *p_Var7;
  __tuple_element_t<2UL,_tuple<unsigned_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_unsigned_long>_>
  *p_Var8;
  size_type sVar9;
  void *pvVar10;
  ValueLength VVar11;
  pointer pAVar12;
  size_t sVar13;
  uint8_t *puVar14;
  long in_RSI;
  int in_EDI;
  exception *ex;
  uint8_t *start;
  shared_ptr<arangodb::velocypack::Builder> builder;
  ofstream ofs;
  Exception *ex_1;
  Parser parser;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *it_1;
  iterator __end3;
  iterator __begin3;
  vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range3;
  size_t printed;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *it;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range2;
  uint64_t nextId;
  size_t requiredLength;
  vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  stats;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  keysFound;
  size_t compressedOccurrences;
  Options options;
  char buffer [32768];
  ifstream ifs;
  string s;
  string infile;
  bool toStdOut;
  char *p;
  int i;
  bool stringify;
  bool hexDump;
  bool compress;
  bool compact;
  bool allowFlags;
  char *outfileName;
  char *infileName;
  Builder *in_stack_ffffffffffff7618;
  Builder *in_stack_ffffffffffff7620;
  undefined7 in_stack_ffffffffffff7628;
  undefined1 in_stack_ffffffffffff762f;
  Parser *in_stack_ffffffffffff7630;
  Parser *in_stack_ffffffffffff7638;
  string *in_stack_ffffffffffff7640;
  Options *in_stack_ffffffffffff7648;
  Parser *in_stack_ffffffffffff7650;
  HexDump *in_stack_ffffffffffff7658;
  Slice in_stack_ffffffffffff7660;
  uint64_t in_stack_ffffffffffff7668;
  AttributeTranslator *in_stack_ffffffffffff7670;
  size_t in_stack_ffffffffffff7678;
  char *in_stack_ffffffffffff7680;
  AttributeTranslator *in_stack_ffffffffffff76c0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffff7710;
  string *in_stack_ffffffffffff7718;
  Slice local_87b0;
  uint8_t *local_87a8;
  allocator<char> local_8799 [40];
  allocator<char> local_8771 [33];
  uint8_t *local_8750;
  allocator<char> local_86e9 [40];
  allocator<char> local_86c1 [33];
  uint8_t *local_86a0;
  undefined8 local_8630;
  undefined8 local_8628;
  ostream local_8620 [520];
  __sv_type local_8418;
  reference local_83c8;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_83c0;
  __normal_iterator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  local_83b8;
  vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_83b0;
  ulong local_83a8;
  __sv_type local_8370;
  reference local_8360;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_8358;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_8350;
  undefined1 *local_8348;
  long local_8340;
  ulong local_8338;
  vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_8330;
  undefined1 local_8318 [56];
  ulong local_82e0;
  pointer local_82d0;
  byte local_82c0;
  byte local_82bf;
  undefined1 local_82ba;
  undefined1 local_82a8 [32772];
  undefined4 local_2a4;
  char local_2a0 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_71;
  string local_70 [35];
  byte local_4d;
  char *local_40;
  int local_34;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  char *local_28;
  char *local_20;
  long local_18;
  int local_10;
  int local_c;
  undefined8 local_8;
  
  local_c = 0;
  local_20 = (char *)0x0;
  local_28 = (char *)0x0;
  local_29 = 1;
  local_2a = 1;
  local_2b = 0;
  local_2c = 0;
  local_2d = 0;
  local_18 = in_RSI;
  local_10 = in_EDI;
  for (local_34 = 1; local_34 < local_10; local_34 = local_34 + 1) {
    local_40 = *(char **)(local_18 + (long)local_34 * 8);
    if (((local_29 & 1) != 0) &&
       (bVar1 = isOption((char *)in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618), bVar1
       )) {
      usage((char **)0x10471d);
      return 0;
    }
    if (((local_29 & 1) == 0) ||
       (bVar1 = isOption((char *)in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618),
       !bVar1)) {
      if (((local_29 & 1) == 0) ||
         (bVar1 = isOption((char *)in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618),
         !bVar1)) {
        if (((local_29 & 1) == 0) ||
           (bVar1 = isOption((char *)in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618),
           !bVar1)) {
          if (((local_29 & 1) == 0) ||
             (bVar1 = isOption((char *)in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618),
             !bVar1)) {
            if (((local_29 & 1) == 0) ||
               (bVar1 = isOption((char *)in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618
                                ), !bVar1)) {
              if (((local_29 & 1) == 0) ||
                 (bVar1 = isOption((char *)in_stack_ffffffffffff7620,
                                   (char *)in_stack_ffffffffffff7618), !bVar1)) {
                if (((local_29 & 1) == 0) ||
                   (bVar1 = isOption((char *)in_stack_ffffffffffff7620,
                                     (char *)in_stack_ffffffffffff7618), !bVar1)) {
                  if (local_20 == (char *)0x0) {
                    local_20 = local_40;
                  }
                  else {
                    if (local_28 != (char *)0x0) {
                      usage((char **)0x104953);
                      return 1;
                    }
                    local_28 = local_40;
                  }
                }
                else {
                  local_29 = 0;
                }
              }
              else {
                local_2d = 1;
              }
            }
            else {
              local_2c = 1;
            }
          }
          else {
            local_2b = 0;
          }
        }
        else {
          local_2b = 1;
        }
      }
      else {
        local_2a = 0;
      }
    }
    else {
      local_2a = 1;
    }
  }
  if (local_20 == (char *)0x0) {
    local_20 = "-";
  }
  if (local_20 == (char *)0x0) {
    usage((char **)0x1049bf);
    local_c = 1;
  }
  else {
    local_4d = 0;
    if ((local_28 == (char *)0x0) || (iVar3 = strcmp(local_28,"+"), iVar3 == 0)) {
      local_28 = "/proc/self/fd/1";
      local_4d = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff7660._start,(char *)in_stack_ffffffffffff7658,
               (allocator<char> *)in_stack_ffffffffffff7650);
    std::allocator<char>::~allocator(&local_71);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffff7620,(char *)in_stack_ffffffffffff7618);
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff7630);
    std::ifstream::ifstream(local_2a0,local_70,_S_in);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot read infile \'");
      poVar4 = std::operator<<(poVar4,local_70);
      poVar4 = std::operator<<(poVar4,"\'");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_c = 1;
      local_2a4 = 1;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (in_stack_ffffffffffff7640,(size_type)in_stack_ffffffffffff7638);
      while (bVar2 = std::ios::good(), (bVar2 & 1) != 0) {
        std::istream::read(local_2a0,(long)local_82a8);
        local_8 = std::istream::gcount();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff7630,
                   (char *)CONCAT17(in_stack_ffffffffffff762f,in_stack_ffffffffffff7628),
                   (size_type)in_stack_ffffffffffff7620);
      }
      std::ifstream::close();
      arangodb::velocypack::Options::Options((Options *)in_stack_ffffffffffff7620);
      local_82c0 = local_2a & 1;
      local_82bf = local_2a & 1;
      if ((local_2b & 1) != 0) {
        local_82e0 = 0;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)0x104d1c);
        buildCompressedKeys(in_stack_ffffffffffff7718,in_stack_ffffffffffff7710);
        std::
        vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::vector((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)0x104d40);
        local_8338 = 2;
        local_8340 = 0;
        local_8348 = local_8318;
        local_8350._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)in_stack_ffffffffffff7618);
        local_8358._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)in_stack_ffffffffffff7618);
        while (bVar1 = std::__detail::operator==(&local_8350,&local_8358),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          local_8360 = std::__detail::
                       _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                       ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                                    *)0x104dbf);
          if ((1 < local_8360->second) &&
             (sVar9 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (&local_8360->first), local_8338 <= sVar9)) {
            std::
            unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
            ::operator->((unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                          *)0x104e01);
            local_8370 = std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffff7620);
            local_8340 = local_8340 + 1;
            key._M_str = in_stack_ffffffffffff7680;
            key._M_len = in_stack_ffffffffffff7678;
            arangodb::velocypack::AttributeTranslator::add
                      (in_stack_ffffffffffff7670,key,in_stack_ffffffffffff7668);
            std::make_tuple<unsigned_long&,std::__cxx11::string_const&,unsigned_long_const&>
                      ((unsigned_long *)
                       CONCAT17(in_stack_ffffffffffff762f,in_stack_ffffffffffff7628),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff7620,(unsigned_long *)in_stack_ffffffffffff7618);
            std::
            vector<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>>
            ::emplace_back<std::tuple<unsigned_long,std::__cxx11::string,unsigned_long>>
                      ((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)in_stack_ffffffffffff7630,
                       (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                        *)CONCAT17(in_stack_ffffffffffff762f,in_stack_ffffffffffff7628));
            std::
            tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
            ::~tuple((tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                      *)0x104ea2);
            pAVar12 = std::
                      unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                      ::operator->((unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                                    *)0x104eae);
            sVar13 = arangodb::velocypack::AttributeTranslator::count(pAVar12);
            if (sVar13 == 0xff) {
              local_8338 = 3;
            }
            local_82e0 = local_8360->second + local_82e0;
          }
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
          ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                        *)in_stack_ffffffffffff7620);
        }
        std::
        unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
        ::operator->((unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                      *)0x104f72);
        arangodb::velocypack::AttributeTranslator::seal(in_stack_ffffffffffff76c0);
        local_82d0 = std::
                     unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                     ::get((unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                            *)in_stack_ffffffffffff7620);
        if (((local_4d & 1) == 0) && (local_82e0 != 0)) {
          poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_82e0);
          poVar4 = std::operator<<(poVar4," occurrences of Object keys will be stored compressed:");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_83a8 = 0;
          local_83b0 = &local_8330;
          local_83b8._M_current =
               (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)std::
                  vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::begin((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)in_stack_ffffffffffff7618);
          local_83c0 = (tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                        *)std::
                          vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          ::end((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                 *)in_stack_ffffffffffff7618);
          while (bVar1 = __gnu_cxx::
                         operator==<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                                   ((__normal_iterator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                                     *)in_stack_ffffffffffff7620,
                                    (__normal_iterator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                                     *)in_stack_ffffffffffff7618), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_83c8 = __gnu_cxx::
                         __normal_iterator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                         ::operator*(&local_83b8);
            local_83a8 = local_83a8 + 1;
            if (0x14 < local_83a8) {
              poVar4 = std::operator<<((ostream *)&std::cout," - ... ");
              sVar5 = std::
                      vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::size(&local_8330);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,(sVar5 - local_83a8) + 1);
              poVar4 = std::operator<<(poVar4," Object key(s) follow ...");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              break;
            }
            poVar4 = std::operator<<((ostream *)&std::cout," - #");
            p_Var6 = std::get<0ul,unsigned_long,std::__cxx11::string,unsigned_long>
                               ((tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                                 *)0x10514d);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,*p_Var6);
            poVar4 = std::operator<<(poVar4,": ");
            p_Var7 = std::get<1ul,unsigned_long,std::__cxx11::string,unsigned_long>
                               ((tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                                 *)0x105192);
            poVar4 = std::operator<<(poVar4,(string *)p_Var7);
            poVar4 = std::operator<<(poVar4," (");
            p_Var8 = std::get<2ul,unsigned_long,std::__cxx11::string,unsigned_long>
                               ((tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                                 *)0x1051d7);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,*p_Var8);
            poVar4 = std::operator<<(poVar4," occurrences)");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            __gnu_cxx::
            __normal_iterator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
            ::operator++(&local_83b8);
          }
        }
        std::
        vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::~vector((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)in_stack_ffffffffffff7630);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          *)0x105255);
      }
      local_82ba = 1;
      arangodb::velocypack::Parser::Parser(in_stack_ffffffffffff7650,in_stack_ffffffffffff7648);
      local_8418 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffff7620);
      json._M_str = (char *)in_stack_ffffffffffff7640;
      json._M_len = (size_t)in_stack_ffffffffffff7638;
      arangodb::velocypack::Parser::parse
                (in_stack_ffffffffffff7630,json,(bool)in_stack_ffffffffffff762f);
      std::ofstream::ofstream(local_8620,local_28,_S_out);
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot write outfile \'");
        poVar4 = std::operator<<(poVar4,local_28);
        poVar4 = std::operator<<(poVar4,"\'");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_c = 1;
        local_2a4 = 1;
      }
      else {
        if ((local_4d & 1) == 0) {
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)in_stack_ffffffffffff7620,
                     (streamoff)in_stack_ffffffffffff7618);
          std::ostream::seekp(local_8620,local_8630,local_8628);
        }
        arangodb::velocypack::Parser::steal(in_stack_ffffffffffff7638);
        if ((local_2c & 1) == 0) {
          if ((local_2d & 1) == 0) {
            std::
            __shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x105aa0);
            puVar14 = arangodb::velocypack::Builder::start(in_stack_ffffffffffff7620);
            local_87a8 = puVar14;
            std::
            __shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x105adf);
            arangodb::velocypack::Builder::size(in_stack_ffffffffffff7620);
            std::ostream::write((char *)local_8620,(long)puVar14);
          }
          else {
            std::operator<<(local_8620,"\"");
            std::
            __shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1058aa);
            local_8750 = (uint8_t *)arangodb::velocypack::Builder::slice(in_stack_ffffffffffff7618);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff7660._start,(char *)in_stack_ffffffffffff7658,
                       (allocator<char> *)in_stack_ffffffffffff7650);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff7660._start,(char *)in_stack_ffffffffffff7658,
                       (allocator<char> *)in_stack_ffffffffffff7650);
            arangodb::velocypack::HexDump::HexDump
                      (in_stack_ffffffffffff7658,in_stack_ffffffffffff7660,
                       (int)((ulong)in_stack_ffffffffffff7650 >> 0x20),
                       (string *)in_stack_ffffffffffff7648,in_stack_ffffffffffff7640);
            poVar4 = arangodb::velocypack::operator<<
                               ((ostream *)in_stack_ffffffffffff7660._start,
                                in_stack_ffffffffffff7658);
            poVar4 = std::operator<<(poVar4,"\"");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            arangodb::velocypack::HexDump::~HexDump((HexDump *)in_stack_ffffffffffff7620);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff7620);
            std::allocator<char>::~allocator(local_8799);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffff7620);
            std::allocator<char>::~allocator(local_8771);
          }
        }
        else {
          std::
          __shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x10568d);
          local_86a0 = (uint8_t *)arangodb::velocypack::Builder::slice(in_stack_ffffffffffff7618);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff7660._start,(char *)in_stack_ffffffffffff7658,
                     (allocator<char> *)in_stack_ffffffffffff7650);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff7660._start,(char *)in_stack_ffffffffffff7658,
                     (allocator<char> *)in_stack_ffffffffffff7650);
          arangodb::velocypack::HexDump::HexDump
                    (in_stack_ffffffffffff7658,in_stack_ffffffffffff7660,
                     (int)((ulong)in_stack_ffffffffffff7650 >> 0x20),
                     (string *)in_stack_ffffffffffff7648,in_stack_ffffffffffff7640);
          poVar4 = arangodb::velocypack::operator<<
                             ((ostream *)in_stack_ffffffffffff7660._start,in_stack_ffffffffffff7658)
          ;
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          arangodb::velocypack::HexDump::~HexDump((HexDump *)in_stack_ffffffffffff7620);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff7620);
          std::allocator<char>::~allocator(local_86e9);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffff7620);
          std::allocator<char>::~allocator(local_86c1);
        }
        std::ofstream::close();
        if ((local_4d & 1) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Successfully converted JSON infile \'");
          poVar4 = std::operator<<(poVar4,local_70);
          poVar4 = std::operator<<(poVar4,"\'");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::cout,"JSON Infile size:    ");
          sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&local_98);
          pvVar10 = (void *)std::ostream::operator<<(poVar4,sVar9);
          std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::cout,"VPack Outfile size:  ");
          std::
          __shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x105c10);
          VVar11 = arangodb::velocypack::Builder::size(in_stack_ffffffffffff7620);
          pvVar10 = (void *)std::ostream::operator<<(poVar4,VVar11);
          std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
          if ((local_2b & 1) != 0) {
            pAVar12 = std::
                      unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                      ::get((unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                             *)in_stack_ffffffffffff7620);
            sVar13 = arangodb::velocypack::AttributeTranslator::count(pAVar12);
            if (sVar13 == 0) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "Key dictionary size: 0 (no benefit from compression)");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"Key dictionary size: ");
              std::
              unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
              ::get((unique_ptr<arangodb::velocypack::AttributeTranslator,_std::default_delete<arangodb::velocypack::AttributeTranslator>_>
                     *)in_stack_ffffffffffff7620);
              arangodb::velocypack::AttributeTranslator::builder((AttributeTranslator *)0x105cae);
              puVar14 = arangodb::velocypack::Builder::data((Builder *)0x105cbf);
              arangodb::velocypack::Slice::Slice(&local_87b0,puVar14);
              VVar11 = arangodb::velocypack::
                       SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                                 ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)in_stack_ffffffffffff7620);
              pvVar10 = (void *)std::ostream::operator<<(poVar4,VVar11);
              std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            }
          }
        }
        std::shared_ptr<arangodb::velocypack::Builder>::~shared_ptr
                  ((shared_ptr<arangodb::velocypack::Builder> *)0x105d50);
        local_2a4 = 0;
      }
      std::ofstream::~ofstream(local_8620);
      arangodb::velocypack::Parser::~Parser((Parser *)0x105d75);
    }
    std::ifstream::~ifstream(local_2a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff7620);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffff7620);
  }
  return local_c;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool compact = true;
  bool compress = false;
  bool hexDump = false;
  bool stringify = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--compact")) {
      compact = true;
    } else if (allowFlags && isOption(p, "--no-compact")) {
      compact = false;
    } else if (allowFlags && isOption(p, "--compress")) {
      compress = true;
    } else if (allowFlags && isOption(p, "--no-compress")) {
      compress = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hexDump = true;
    } else if (allowFlags && isOption(p, "--stringify")) {
      stringify = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  char buffer[32768];
  s.reserve(sizeof(buffer));

  while (ifs.good()) {
    ifs.read(&buffer[0], sizeof(buffer));
    s.append(buffer, checkOverflow(ifs.gcount()));
  }
  ifs.close();

  Options options;
  options.buildUnindexedArrays = compact;
  options.buildUnindexedObjects = compact;

  // compress object keys?
  if (compress) {
    size_t compressedOccurrences = 0;
    std::unordered_map<std::string, size_t> keysFound;
    buildCompressedKeys(s, keysFound);

    std::vector<std::tuple<uint64_t, std::string, size_t>> stats;
    size_t requiredLength = 2;
    uint64_t nextId = 0;
    for (auto const& it : keysFound) {
      if (it.second > 1 && it.first.size() >= requiredLength) {
        translator->add(it.first, ++nextId);
        stats.emplace_back(std::make_tuple(nextId, it.first, it.second));

        if (translator->count() == 255) {
          requiredLength = 3;
        }
        compressedOccurrences += it.second;
      }
    }
    translator->seal();

    options.attributeTranslator = translator.get();

    // print statistics
    if (!toStdOut && compressedOccurrences > 0) {
      std::cout << compressedOccurrences
                << " occurrences of Object keys will be stored compressed:"
                << std::endl;

      size_t printed = 0;
      for (auto const& it : stats) {
        if (++printed > 20) {
          std::cout << " - ... " << (stats.size() - printed + 1)
                    << " Object key(s) follow ..." << std::endl;
          break;
        }
        std::cout << " - #" << std::get<0>(it) << ": " << std::get<1>(it)
                  << " (" << std::get<2>(it) << " occurrences)" << std::endl;
      }
    }
  }

  options.validateUtf8Strings = true;
  Parser parser(&options);
  try {
    parser.parse(s);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while parsing infile '" << infile
              << "': " << ex.what() << std::endl;
    std::cerr << "Error position: " << parser.errorPos() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while parsing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  std::shared_ptr<Builder> builder = parser.steal();
  if (hexDump) {
    ofs << HexDump(builder->slice()) << std::endl;
  } else if (stringify) {
    ofs << "\"" << HexDump(builder->slice(), 2048, "", "\\x") << "\""
        << std::endl;
  } else {
    uint8_t const* start = builder->start();
    ofs.write(reinterpret_cast<char const*>(start), builder->size());
  }

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "JSON Infile size:    " << s.size() << std::endl;
    std::cout << "VPack Outfile size:  " << builder->size() << std::endl;

    if (compress) {
      if (translator.get()->count() > 0) {
        std::cout << "Key dictionary size: "
                  << Slice(translator.get()->builder()->data()).byteSize()
                  << std::endl;
      } else {
        std::cout << "Key dictionary size: 0 (no benefit from compression)"
                  << std::endl;
      }
    }
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}